

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiddleVal.cpp
# Opt level: O0

bool __thiscall MiddleVal::operator<=(MiddleVal *this,MiddleVal *t)

{
  bool bVar1;
  double local_28;
  double b;
  double a;
  MiddleVal *t_local;
  MiddleVal *this_local;
  
  bVar1 = std::operator==(&this->Type,"real");
  if (bVar1) {
    b = this->dVal;
  }
  else {
    b = (double)this->iVal;
  }
  bVar1 = std::operator==(&t->Type,"real");
  if (bVar1) {
    local_28 = t->dVal;
  }
  else {
    local_28 = (double)t->iVal;
  }
  return b <= local_28;
}

Assistant:

bool MiddleVal::operator<=(MiddleVal t) {
    double a,b;
    if (Type == "real") {
        a = dVal;
    } else {
        a = iVal;
    }
    if (t.Type == "real") {
        b = t.dVal;
    } else {
        b = t.iVal;
    }
    return a<=b;
}